

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

FT_Error afm_parser_parse(AFM_Parser parser)

{
  int iVar1;
  AFM_Token AVar2;
  FT_Int FVar3;
  FT_Error FVar4;
  FT_Int local_8c;
  undefined1 local_88 [4];
  FT_Int n;
  AFM_ValueRec shared_vals [4];
  FT_Offset FStack_40;
  FT_Int metrics_sets;
  FT_Offset len;
  char *key;
  AFM_FontInfo pAStack_28;
  FT_Error error;
  AFM_FontInfo fi;
  FT_Memory memory;
  AFM_Parser parser_local;
  
  fi = (AFM_FontInfo)parser->memory;
  pAStack_28 = parser->FontInfo;
  key._4_4_ = 0xa0;
  shared_vals[3].u.f._4_4_ = 0;
  if (pAStack_28 == (AFM_FontInfo)0x0) {
    parser_local._4_4_ = 6;
  }
  else {
    memory = (FT_Memory)parser;
    len = (FT_Offset)afm_parser_next_key(parser,'\x01',&stack0xffffffffffffffc0);
    if ((((char *)len != (char *)0x0) && (FStack_40 == 0x10)) &&
       (iVar1 = strncmp((char *)len,"StartFontMetrics",0x10), iVar1 == 0)) {
LAB_00303fc3:
      len = (FT_Offset)afm_parser_next_key((AFM_Parser)memory,'\x01',&stack0xffffffffffffffc0);
      if ((char *)len == (char *)0x0) goto LAB_003041c3;
      AVar2 = afm_tokenize((char *)len,FStack_40);
      switch(AVar2) {
      case AFM_TOKEN_ASCENDER:
        local_88 = (undefined1  [4])0x2;
        FVar3 = afm_parser_read_vals((AFM_Parser)memory,(AFM_Value)local_88,1);
        if (FVar3 == 1) {
          pAStack_28->Ascender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
          goto LAB_00303fc3;
        }
        break;
      default:
        goto LAB_00303fc3;
      case AFM_TOKEN_DESCENDER:
        local_88 = (undefined1  [4])0x2;
        FVar3 = afm_parser_read_vals((AFM_Parser)memory,(AFM_Value)local_88,1);
        if (FVar3 == 1) {
          pAStack_28->Descender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
          goto LAB_00303fc3;
        }
        break;
      case AFM_TOKEN_ENDFONTMETRICS:
        return 0;
      case AFM_TOKEN_FONTBBOX:
        local_88 = (undefined1  [4])0x2;
        shared_vals[0].u.i = 2;
        shared_vals[1].u.i = 2;
        shared_vals[2].u.i = 2;
        FVar3 = afm_parser_read_vals((AFM_Parser)memory,(AFM_Value)local_88,4);
        if (FVar3 == 4) {
          (pAStack_28->FontBBox).xMin =
               CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
          (pAStack_28->FontBBox).yMin = shared_vals[1]._0_8_;
          (pAStack_28->FontBBox).xMax = shared_vals[2]._0_8_;
          (pAStack_28->FontBBox).yMax = shared_vals[3]._0_8_;
          goto LAB_00303fc3;
        }
        break;
      case AFM_TOKEN_ISCIDFONT:
        local_88 = (undefined1  [4])0x4;
        FVar3 = afm_parser_read_vals((AFM_Parser)memory,(AFM_Value)local_88,1);
        if (FVar3 == 1) {
          pAStack_28->IsCIDFont = (undefined1)shared_vals[0].type;
          goto LAB_00303fc3;
        }
        break;
      case AFM_TOKEN_METRICSSETS:
        FVar4 = afm_parser_read_int((AFM_Parser)memory,(FT_Int *)((long)&shared_vals[3].u + 4));
        if (FVar4 == 0) {
          if ((shared_vals[3].u.f._4_4_ == 0) || (shared_vals[3].u.f._4_4_ == 2)) goto LAB_00303fc3;
          key._4_4_ = 7;
        }
        break;
      case AFM_TOKEN_STARTCHARMETRICS:
        local_8c = 0;
        FVar4 = afm_parser_read_int((AFM_Parser)memory,&local_8c);
        if (FVar4 != 0) break;
        key._4_4_ = afm_parser_skip_section((AFM_Parser)memory,local_8c,AFM_TOKEN_ENDCHARMETRICS);
        if (key._4_4_ != 0) {
          return key._4_4_;
        }
        goto LAB_00303fc3;
      case AFM_TOKEN_STARTKERNDATA:
        key._4_4_ = afm_parse_kern_data((AFM_Parser)memory);
        if (key._4_4_ == 0) {
          return 0;
        }
      }
LAB_003041c3:
      ft_mem_free((FT_Memory)fi,pAStack_28->TrackKerns);
      pAStack_28->TrackKerns = (AFM_TrackKern)0x0;
      pAStack_28->NumTrackKern = 0;
      ft_mem_free((FT_Memory)fi,pAStack_28->KernPairs);
      pAStack_28->KernPairs = (AFM_KernPair)0x0;
      pAStack_28->NumKernPair = 0;
      pAStack_28->IsCIDFont = '\0';
      return key._4_4_;
    }
    parser_local._4_4_ = 2;
  }
  return parser_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }